

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cc
# Opt level: O1

void __thiscall
Object::makePolygons4Render
          (Object *this,Vector2d *obs,
          vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
          *polygons)

{
  pointer *ppvVar1;
  pointer pEVar2;
  iterator __position;
  _Elt_pointer pMVar3;
  _Elt_pointer pMVar4;
  Edge *eg;
  pointer pEVar5;
  vector<cv::Point_<int>,std::allocator<cv::Point_<int>>> *this_00;
  Vector3d *p;
  _Elt_pointer __args;
  _Map_pointer ppMVar6;
  
  pEVar5 = (this->edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
           super__Vector_impl_data._M_start;
  pEVar2 = (this->edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pEVar5 != pEVar2) {
    do {
      if (pEVar5->valid != false) {
        __position._M_current =
             (polygons->
             super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (polygons->
            super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
          ::_M_realloc_insert<>(polygons,__position);
        }
        else {
          ((__position._M_current)->
          super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>)._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          ((__position._M_current)->
          super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>)._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          ((__position._M_current)->
          super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ppvVar1 = &(polygons->
                     super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppvVar1 = *ppvVar1 + 1;
        }
        this_00 = (vector<cv::Point_<int>,std::allocator<cv::Point_<int>>> *)
                  ((polygons->
                   super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish + -1);
        std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>::emplace_back<double&,double&>
                  (this_00,(double *)obs,
                   (obs->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
                   m_data.array + 1);
        __args = (pEVar5->
                 super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ).
                 super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
        pMVar3 = (pEVar5->
                 super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ).
                 super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (__args != pMVar3) {
          pMVar4 = (pEVar5->
                   super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   ).
                   super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_last;
          ppMVar6 = (pEVar5->
                    super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                    ).
                    super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_node;
          do {
            std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>::
            emplace_back<double_const&,double_const&>
                      (this_00,(double *)__args,
                       (__args->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                       m_storage.m_data.array + 1);
            __args = __args + 1;
            if (__args == pMVar4) {
              __args = ppMVar6[1];
              ppMVar6 = ppMVar6 + 1;
              pMVar4 = __args + 0x15;
            }
          } while (__args != pMVar3);
        }
      }
      pEVar5 = pEVar5 + 1;
    } while (pEVar5 != pEVar2);
  }
  return;
}

Assistant:

void Object::makePolygons4Render(Eigen::Vector2d obs, std::vector<std::vector<cv::Point>>& polygons) const{
    for (const Edge& eg: edges) {
        if (eg.valid == false) continue;
        polygons.emplace_back();
        std::vector<cv::Point>& back = polygons.back();
        back.emplace_back(obs.x(), obs.y());
        for (const Eigen::Vector3d& p: eg) {
            back.emplace_back(p.x(), p.y());
        }
    }
}